

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O2

int jas_image_encode(jas_image_t *image,jas_stream_t *out,int fmt,char *optstr)

{
  _func_int_jas_image_t_ptr_jas_stream_t_ptr_char_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  jas_image_fmtinfo_t *pjVar2;
  
  pjVar2 = jas_image_lookupfmtbyid(fmt);
  if (pjVar2 == (jas_image_fmtinfo_t *)0x0) {
    jas_eprintf("format lookup failed\n");
  }
  else {
    UNRECOVERED_JUMPTABLE = (pjVar2->ops).encode;
    if (UNRECOVERED_JUMPTABLE != (_func_int_jas_image_t_ptr_jas_stream_t_ptr_char_ptr *)0x0) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)(image,out,optstr);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int jas_image_encode(jas_image_t *image, jas_stream_t *out, int fmt,
  const char *optstr)
{
	const jas_image_fmtinfo_t *fmtinfo;
	if (!(fmtinfo = jas_image_lookupfmtbyid(fmt))) {
		jas_eprintf("format lookup failed\n");
		return -1;
	}
	return (fmtinfo->ops.encode) ? (*fmtinfo->ops.encode)(image, out,
	  optstr) : (-1);
}